

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred.c
# Opt level: O3

void com_mc_affine(com_core_t *core,pel *pred_buf)

{
  pthread_mutex_t *ppVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  com_pic_t *pcVar7;
  com_seqh_t *pcVar8;
  com_pic_t *pcVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  s32 (*paasVar20) [1024] [2];
  int iVar21;
  pel *ppVar22;
  long lVar23;
  pel *ppVar24;
  pel *ppVar25;
  int iVar26;
  long lVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  s32 (*paasVar33) [1024] [2];
  pel pred_snd [24576];
  pel *local_6160;
  uint local_6154;
  pel *local_6120;
  pel local_6060 [24624];
  
  bVar2 = core->refi[0];
  if ((char)bVar2 < '\0') {
    local_6154 = 0;
  }
  else {
    local_6154 = (uint)(-1 < core->refi[1]);
  }
  iVar3 = core->cu_width;
  iVar4 = core->cu_height;
  lVar27 = 8;
  iVar21 = 0;
  if ((core->pichdr->affine_subblock_size_idx == 1) || ((-1 < (char)bVar2 && (-1 < core->refi[1]))))
  {
    bVar10 = false;
  }
  else {
    lVar27 = 4;
    bVar10 = true;
  }
  pcVar7 = core->pic;
  iVar5 = core->cu_pix_x;
  iVar6 = core->cu_pix_y;
  iVar26 = (int)lVar27;
  lVar13 = (long)g_tbl_log2[lVar27];
  uVar14 = (ulong)(uint)(bVar2 >> 7);
  do {
    local_6160 = pred_buf;
    if (iVar21 != 0) {
      local_6160 = local_6060;
    }
    iVar12 = iVar3;
    if ((iVar21 == 0 && local_6154 == 0) && (local_6160 = pred_buf, *(int *)core->cbfy == 0)) {
      iVar12 = pcVar7->stride_luma;
      local_6160 = pcVar7->y + (long)iVar5 + (long)(iVar12 * iVar6);
    }
    pcVar8 = core->seqhdr;
    iVar16 = pcVar8->bit_depth_internal;
    if (0 < iVar4) {
      pcVar9 = core->refp[core->refi[uVar14]][uVar14].pic;
      iVar15 = pcVar8->pic_width + 4;
      iVar11 = pcVar8->pic_height + 4;
      iVar18 = pcVar9->stride_luma;
      paasVar20 = core->affine_sb_mv + uVar14;
      ppVar1 = &pcVar9->mutex;
      iVar17 = 0;
      do {
        if (0 < iVar3) {
          lVar23 = 0;
          do {
            uVar30 = (*paasVar20)[0][0];
            uVar29 = (*paasVar20)[0][1];
            iVar28 = (int)(((int)lVar23 + iVar5) * 0x10 + uVar30) >> 4;
            iVar32 = (int)(uVar29 + (iVar17 + iVar6) * 0x10) >> 4;
            if (iVar15 <= iVar28) {
              iVar28 = iVar15;
            }
            if (iVar28 < -0x83) {
              iVar28 = -0x84;
            }
            if (iVar11 <= iVar32) {
              iVar32 = iVar11;
            }
            if (iVar32 < -0x83) {
              iVar32 = -0x84;
            }
            iVar19 = iVar26 + 4 + iVar32;
            if (pcVar9->finished_line < iVar19) {
              pthread_mutex_lock((pthread_mutex_t *)ppVar1);
              while (pcVar9->finished_line < iVar19) {
                pthread_cond_wait((pthread_cond_t *)&pcVar9->cond,(pthread_mutex_t *)ppVar1);
              }
              pthread_mutex_unlock((pthread_mutex_t *)ppVar1);
            }
            ppVar24 = local_6160 + lVar23;
            uVar30 = uVar30 & 0xf;
            uVar29 = uVar29 & 0xf;
            ppVar22 = pcVar9->y + (long)iVar28 + (long)(iVar32 * iVar18);
            if (uVar29 == 0 && uVar30 == 0) {
              (*(code *)g_tbl_itrans[2][lVar13 + 4])();
            }
            else if (uVar29 == 0) {
              (*uavs3d_funs_handle.ipcpy[lVar13 + 4])(ppVar22,iVar18,ppVar24,iVar12,iVar26,iVar26);
            }
            else if (uVar30 == 0) {
              (*uavs3d_funs_handle.ipflt[1][lVar13 + 4])
                        (ppVar22,iVar18,ppVar24,iVar12,iVar26,iVar26,
                         g_tbl_mc_coeff_luma_hp[0] + (uVar29 << 3),~(-1 << ((byte)iVar16 & 0x1f)));
            }
            else {
              (*(*(_func_void_pel_ptr_int_pel_ptr_int_int_int_s8_ptr_int *(*) [6])
                  (uavs3d_funs_handle.ipflt_ext + -1))[lVar13 + 4])
                        (ppVar22,iVar18,ppVar24,iVar12,iVar26,iVar26,g_tbl_mc_coeff_luma_hp[uVar30],
                         uVar29 * 8 + 0x163e10);
            }
            lVar23 = lVar23 + lVar27;
            paasVar20 = (s32 (*) [1024] [2])(*paasVar20 + 1);
          } while ((int)lVar23 < iVar3);
        }
        local_6160 = local_6160 + iVar12 * iVar26;
        iVar17 = iVar17 + iVar26;
      } while (iVar17 < iVar4);
    }
    uVar14 = (ulong)(uVar14 == 0);
    iVar21 = iVar21 + 1;
  } while (iVar21 != local_6154 + 1);
  uVar14 = (ulong)(uint)(bVar2 >> 7);
  if ((char)local_6154 != '\0') {
    ppVar24 = pred_buf;
    iVar21 = iVar3;
    if (*(int *)core->cbfy == 0) {
      iVar21 = pcVar7->stride_luma;
      ppVar24 = pcVar7->y + (long)iVar5 + (long)(iVar21 * iVar6);
    }
    (*uavs3d_funs_handle.avg_pel[(long)core->cu_log2w + -2])
              (ppVar24,iVar21,pred_buf,local_6060,iVar3,iVar4);
  }
  ppVar24 = pred_buf + iVar4 * iVar3;
  iVar21 = 0;
  do {
    local_6120 = ppVar24;
    if (iVar21 != 0) {
      local_6120 = local_6060;
    }
    local_6160._0_4_ = iVar3;
    if ((iVar21 == 0 && local_6154 == 0) && (local_6120 = ppVar24, *(short *)core->cbfc == 0)) {
      local_6160._0_4_ = pcVar7->stride_chroma;
      local_6120 = pcVar7->uv + (long)iVar5 + (long)((int)local_6160 * (iVar6 / 2));
    }
    pcVar9 = core->refp[core->refi[uVar14]][uVar14].pic;
    paasVar20 = core->affine_sb_mv + uVar14;
    pcVar8 = core->seqhdr;
    uVar30 = ~(-1 << ((byte)pcVar8->bit_depth_internal & 0x1f));
    iVar16 = pcVar8->pic_width + 4 >> 1;
    iVar12 = pcVar8->pic_height + 4 >> 1;
    iVar26 = pcVar9->stride_chroma;
    if (bVar10) {
      if (0 < iVar4) {
        ppVar1 = &pcVar9->mutex;
        iVar18 = 0;
        paasVar33 = paasVar20;
        do {
          paasVar20 = (s32 (*) [1024] [2])(*paasVar20 + (iVar3 >> 2));
          if (0 < iVar3) {
            lVar27 = 0;
            do {
              uVar29 = ((*paasVar20)[1][1] +
                        (*paasVar33)[0][1] + (*paasVar33)[1][1] + (*paasVar20)[0][1] + 2 >> 2) +
                       (iVar6 + iVar18) * 0x10;
              uVar31 = ((int)lVar27 + iVar5) * 0x10 +
                       ((*paasVar33)[0][0] + (*paasVar33)[1][0] + (*paasVar20)[0][0] +
                        (*paasVar20)[1][0] + 2 >> 2);
              iVar11 = (int)uVar31 >> 5;
              iVar15 = (int)uVar29 >> 5;
              if (iVar16 <= iVar11) {
                iVar11 = iVar16;
              }
              iVar17 = iVar11 * 2;
              if (iVar11 < -0x42) {
                iVar17 = -0x84;
              }
              if (iVar12 <= iVar15) {
                iVar15 = iVar12;
              }
              if (iVar15 < -0x41) {
                iVar15 = -0x42;
              }
              iVar11 = iVar15 * 2 + 0xc;
              if (pcVar9->finished_line < iVar11) {
                pthread_mutex_lock((pthread_mutex_t *)ppVar1);
                while (pcVar9->finished_line < iVar11) {
                  pthread_cond_wait((pthread_cond_t *)&pcVar9->cond,(pthread_mutex_t *)ppVar1);
                }
                pthread_mutex_unlock((pthread_mutex_t *)ppVar1);
              }
              ppVar22 = local_6120 + lVar27;
              uVar31 = uVar31 & 0x1f;
              uVar29 = uVar29 & 0x1f;
              ppVar25 = pcVar9->uv + (long)iVar17 + (long)(iVar15 * iVar26);
              if (uVar29 == 0 && uVar31 == 0) {
                (*uavs3d_funs_handle.ipcpy[1])(ppVar25,iVar26,ppVar22,(int)local_6160,8,4);
              }
              else if (uVar29 == 0) {
                (*uavs3d_funs_handle.ipflt[1][1])
                          (ppVar25,iVar26,ppVar22,(int)local_6160,8,4,
                           g_tbl_mc_coeff_chroma_hp[0] + (uVar31 << 2),uVar30);
              }
              else if (uVar31 == 0) {
                (*uavs3d_funs_handle.ipflt[3][1])
                          (ppVar25,iVar26,ppVar22,(int)local_6160,8,4,
                           g_tbl_mc_coeff_chroma_hp[0] + (uVar29 << 2),uVar30);
              }
              else {
                (*uavs3d_funs_handle.ipflt_ext[1][1])
                          (ppVar25,iVar26,ppVar22,(int)local_6160,8,4,
                           g_tbl_mc_coeff_chroma_hp[uVar31],g_tbl_mc_coeff_chroma_hp[uVar29],uVar30)
                ;
              }
              lVar27 = lVar27 + 8;
              paasVar33 = (s32 (*) [1024] [2])(*paasVar33 + 2);
              paasVar20 = (s32 (*) [1024] [2])(*paasVar20 + 2);
            } while ((int)lVar27 < iVar3);
          }
          local_6120 = local_6120 + (int)local_6160 * 4;
          paasVar33 = (s32 (*) [1024] [2])(*paasVar33 + (iVar3 >> 2));
          iVar18 = iVar18 + 8;
        } while (iVar18 < iVar4);
      }
    }
    else if (0 < iVar4) {
      ppVar1 = &pcVar9->mutex;
      iVar18 = 0;
      do {
        if (0 < iVar3) {
          lVar27 = 0;
          do {
            uVar29 = ((int)lVar27 + iVar5) * 0x10 + (*paasVar20)[0][0];
            uVar31 = (*paasVar20)[0][1] + (iVar18 + iVar6) * 0x10;
            iVar11 = (int)uVar29 >> 5;
            iVar15 = (int)uVar31 >> 5;
            if (iVar16 <= iVar11) {
              iVar11 = iVar16;
            }
            iVar17 = iVar11 * 2;
            if (iVar11 < -0x42) {
              iVar17 = -0x84;
            }
            if (iVar12 <= iVar15) {
              iVar15 = iVar12;
            }
            if (iVar15 < -0x41) {
              iVar15 = -0x42;
            }
            iVar11 = iVar15 * 2 + 0xc;
            if (pcVar9->finished_line < iVar11) {
              pthread_mutex_lock((pthread_mutex_t *)ppVar1);
              iVar28 = pcVar9->finished_line;
              while (iVar28 < iVar11) {
                pthread_cond_wait((pthread_cond_t *)&pcVar9->cond,(pthread_mutex_t *)ppVar1);
                iVar28 = pcVar9->finished_line;
              }
              pthread_mutex_unlock((pthread_mutex_t *)ppVar1);
            }
            ppVar22 = local_6120 + lVar27;
            uVar29 = uVar29 & 0x1f;
            uVar31 = uVar31 & 0x1f;
            ppVar25 = pcVar9->uv + (long)iVar17 + (long)(iVar15 * iVar26);
            if (uVar31 == 0 && uVar29 == 0) {
              (*uavs3d_funs_handle.ipcpy[1])(ppVar25,iVar26,ppVar22,(int)local_6160,8,4);
            }
            else if (uVar31 == 0) {
              (*uavs3d_funs_handle.ipflt[1][1])
                        (ppVar25,iVar26,ppVar22,(int)local_6160,8,4,
                         g_tbl_mc_coeff_chroma_hp[0] + (uVar29 << 2),uVar30);
            }
            else if (uVar29 == 0) {
              (*uavs3d_funs_handle.ipflt[3][1])
                        (ppVar25,iVar26,ppVar22,(int)local_6160,8,4,
                         g_tbl_mc_coeff_chroma_hp[0] + (uVar31 << 2),uVar30);
            }
            else {
              (*uavs3d_funs_handle.ipflt_ext[1][1])
                        (ppVar25,iVar26,ppVar22,(int)local_6160,8,4,g_tbl_mc_coeff_chroma_hp[uVar29]
                         ,g_tbl_mc_coeff_chroma_hp[uVar31],uVar30);
            }
            lVar27 = lVar27 + 8;
            paasVar20 = (s32 (*) [1024] [2])(*paasVar20 + 1);
          } while ((int)lVar27 < iVar3);
        }
        local_6120 = local_6120 + (int)local_6160 * 4;
        iVar18 = iVar18 + 8;
      } while (iVar18 < iVar4);
    }
    uVar14 = (ulong)(uVar14 == 0);
    iVar21 = iVar21 + 1;
  } while (iVar21 != local_6154 + 1);
  if ((char)local_6154 != '\0') {
    ppVar22 = ppVar24;
    iVar21 = iVar3;
    if (*(short *)core->cbfc == 0) {
      iVar21 = pcVar7->stride_chroma;
      ppVar22 = pcVar7->uv + (long)iVar5 + (long)((iVar6 / 2) * iVar21);
    }
    (*uavs3d_funs_handle.avg_pel[(long)core->cu_log2w + -2])
              (ppVar22,iVar21,ppVar24,local_6060,iVar3,iVar4 >> 1);
  }
  return;
}

Assistant:

void com_mc_affine(com_core_t *core, pel *pred_buf)
{
    com_pic_t *pic = core->pic;
    int x = core->cu_pix_x;
    int y = core->cu_pix_y;
    int cu_width = core->cu_width;
    int cu_height = core->cu_height;
    com_ref_pic_t(*refp)[REFP_NUM] = core->refp;
    s8 *refi = core->refi;
    com_pic_t *ref_pic;
    ALIGNED_32(pel pred_snd[MAX_CU_DIM + MAX_CU_DIM / 2]);
    int sub_blk_size;
    int bi = REFI_IS_VALID(refi[REFP_0]) && REFI_IS_VALID(refi[REFP_1]);
    int lidx, lidx_base = REFI_IS_VALID(refi[REFP_0]) ? REFP_0 : REFP_1;
    pel *dstl, *dstc;
    int i_dstl, i_dstc;
    int blk_dim = cu_width * cu_height;

    if (core->pichdr->affine_subblock_size_idx == 1 || (REFI_IS_VALID(refi[REFP_0]) && REFI_IS_VALID(refi[REFP_1]))) {
        sub_blk_size = 8;
    } else {
        sub_blk_size = 4;
    }

    lidx = lidx_base;

    for (int i = 0; i <= bi; i++) {
        ref_pic = refp[refi[lidx]][lidx].pic;

        if (i) {
            i_dstl = cu_width;
            dstl = pred_snd;
        } else if (!bi && !M32(core->cbfy)) {
            i_dstl = pic->stride_luma;
            dstl = pic->y + y * i_dstl + x;
        } else {
            i_dstl = cu_width;
            dstl = pred_buf;
        }
        com_affine_mc_luma(core, dstl, i_dstl, x, y, cu_width, cu_height, ref_pic, sub_blk_size, lidx);
        lidx = !lidx;
    }
    if (bi) {
        if (!M32(core->cbfy)) {
            i_dstl = pic->stride_luma;
            dstl = pic->y + y * i_dstl + x;
        } else {
            i_dstl = cu_width;
            dstl = pred_buf;
        }
        uavs3d_funs_handle.avg_pel[core->cu_log2w - 2](dstl, i_dstl, pred_buf, pred_snd, cu_width, cu_height);
    }

    lidx = lidx_base;

    for (int i = 0; i <= bi; i++) {
        ref_pic = refp[refi[lidx]][lidx].pic;

        if (i) {
            i_dstc = cu_width;
            dstc = pred_snd;
        } else if (!bi && !M16(core->cbfc)) {
            i_dstc = pic->stride_chroma;
            dstc = pic->uv + y / 2 * i_dstc + x;
        } else {
            i_dstc = cu_width;
            dstc = pred_buf + blk_dim;
        }
        com_affine_mc_chroma(core, dstc, i_dstc, x, y, cu_width, cu_height, ref_pic, sub_blk_size, lidx);
        lidx = !lidx;
    }
    if (bi) {
        if (!M16(core->cbfc)) {
            i_dstc = pic->stride_chroma;
            dstc = pic->uv + y / 2 * i_dstc + x;
        } else {
            i_dstc = cu_width;
            dstc = pred_buf + blk_dim;
        }
        uavs3d_funs_handle.avg_pel[core->cu_log2w - 2](dstc, i_dstc, pred_buf + blk_dim, pred_snd, cu_width, cu_height >> 1);
    }
}